

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::ipc::BufferedFrameDeserializer::DecodeFrame
          (BufferedFrameDeserializer *this,char *data,size_t size)

{
  size_t *psVar1;
  int iVar2;
  IPCFrame *this_00;
  _List_node_base *p_Var3;
  
  if (size != 0) {
    this_00 = (IPCFrame *)operator_new(0x78);
    protos::gen::IPCFrame::IPCFrame(this_00);
    iVar2 = (*(this_00->super_CppMessageObj)._vptr_CppMessageObj[4])(this_00,data,size);
    if ((char)iVar2 == '\0') {
      (*(this_00->super_CppMessageObj)._vptr_CppMessageObj[1])(this_00);
      return;
    }
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)this_00;
    ::std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->decoded_frames_).
              super__List_base<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>,_std::allocator<std::unique_ptr<perfetto::protos::gen::IPCFrame,_std::default_delete<perfetto::protos::gen::IPCFrame>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void BufferedFrameDeserializer::DecodeFrame(const char* data, size_t size) {
  if (size == 0)
    return;
  std::unique_ptr<Frame> frame(new Frame);
  if (frame->ParseFromArray(data, size))
    decoded_frames_.push_back(std::move(frame));
}